

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1cmap.c
# Opt level: O3

FT_Error t1_cmap_unicode_init(PS_Unicodes unicodes,FT_Pointer pointer)

{
  undefined4 uVar1;
  FT_Face pFVar2;
  code *UNRECOVERED_JUMPTABLE;
  FT_Error FVar3;
  
  pFVar2 = (unicodes->cmap).charmap.face;
  UNRECOVERED_JUMPTABLE = *(code **)(pFVar2[3].num_glyphs + 8);
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    uVar1._0_2_ = pFVar2[2].max_advance_width;
    uVar1._2_2_ = pFVar2[2].max_advance_height;
    FVar3 = (*UNRECOVERED_JUMPTABLE)(pFVar2->memory,unicodes,uVar1,psaux_get_glyph_name,0);
    return FVar3;
  }
  return 7;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  t1_cmap_unicode_init( PS_Unicodes  unicodes,
                        FT_Pointer   pointer )
  {
    T1_Face             face    = (T1_Face)FT_CMAP_FACE( unicodes );
    FT_Memory           memory  = FT_FACE_MEMORY( face );
    FT_Service_PsCMaps  psnames = (FT_Service_PsCMaps)face->psnames;

    FT_UNUSED( pointer );


    if ( !psnames->unicodes_init )
      return FT_THROW( Unimplemented_Feature );

    return psnames->unicodes_init( memory,
                                   unicodes,
                                   (FT_UInt)face->type1.num_glyphs,
                                   (PS_GetGlyphNameFunc)&psaux_get_glyph_name,
                                   (PS_FreeGlyphNameFunc)NULL,
                                   (FT_Pointer)face );
  }